

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

void fill_data_and_get_bounds
               (uint8_t *src,int src_stride,int rows,int cols,int is_high_bitdepth,int16_t *data,
               int *lower_bound,int *upper_bound)

{
  byte bVar1;
  ushort uVar2;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  int val_1;
  int c_1;
  int r_1;
  int val;
  int c;
  int r;
  uint16_t *src_ptr;
  int16_t *data_local;
  int is_high_bitdepth_local;
  int cols_local;
  int rows_local;
  int src_stride_local;
  uint8_t *src_local;
  
  data_local = data;
  if (is_high_bitdepth == 0) {
    bVar1 = *src;
    *upper_bound = (uint)bVar1;
    *lower_bound = (uint)bVar1;
    src_local = src;
    for (r_1 = 0; r_1 < rows; r_1 = r_1 + 1) {
      for (c_1 = 0; c_1 < cols; c_1 = c_1 + 1) {
        local_50 = (uint)src_local[c_1];
        data_local[c_1] = (ushort)src_local[c_1];
        local_4c = local_50;
        if (*lower_bound < (int)local_50) {
          local_4c = *lower_bound;
        }
        *lower_bound = local_4c;
        if ((int)local_50 < *upper_bound) {
          local_50 = *upper_bound;
        }
        *upper_bound = local_50;
      }
      src_local = src_local + src_stride;
      data_local = data_local + cols;
    }
  }
  else {
    src_ptr = (uint16_t *)((long)src << 1);
    uVar2 = *src_ptr;
    *upper_bound = (uint)uVar2;
    *lower_bound = (uint)uVar2;
    for (r = 0; r < rows; r = r + 1) {
      for (c = 0; c < cols; c = c + 1) {
        local_48 = (uint)src_ptr[c];
        data_local[c] = src_ptr[c];
        local_44 = local_48;
        if (*lower_bound < (int)local_48) {
          local_44 = *lower_bound;
        }
        *lower_bound = local_44;
        if ((int)local_48 < *upper_bound) {
          local_48 = *upper_bound;
        }
        *upper_bound = local_48;
      }
      src_ptr = src_ptr + src_stride;
      data_local = data_local + cols;
    }
  }
  return;
}

Assistant:

static inline void fill_data_and_get_bounds(const uint8_t *src,
                                            const int src_stride,
                                            const int rows, const int cols,
                                            const int is_high_bitdepth,
                                            int16_t *data, int *lower_bound,
                                            int *upper_bound) {
  if (is_high_bitdepth) {
    const uint16_t *src_ptr = CONVERT_TO_SHORTPTR(src);
    *lower_bound = *upper_bound = src_ptr[0];
    for (int r = 0; r < rows; ++r) {
      for (int c = 0; c < cols; ++c) {
        const int val = src_ptr[c];
        data[c] = (int16_t)val;
        *lower_bound = AOMMIN(*lower_bound, val);
        *upper_bound = AOMMAX(*upper_bound, val);
      }
      src_ptr += src_stride;
      data += cols;
    }
    return;
  }

  // low bit depth
  *lower_bound = *upper_bound = src[0];
  for (int r = 0; r < rows; ++r) {
    for (int c = 0; c < cols; ++c) {
      const int val = src[c];
      data[c] = (int16_t)val;
      *lower_bound = AOMMIN(*lower_bound, val);
      *upper_bound = AOMMAX(*upper_bound, val);
    }
    src += src_stride;
    data += cols;
  }
}